

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::visitSIMDLoadStoreLane(FunctionValidator *this,SIMDLoadStoreLane *curr)

{
  bool bVar1;
  Index bytes;
  Memory *pMVar2;
  ulong uVar3;
  Type TVar4;
  char *text;
  
  pMVar2 = Module::getMemoryOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->memory).super_IString.str);
  ValidationInfo::shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this->info,pMVar2 != (Memory *)0x0,curr,"memory.SIMDLoadStoreLane memory must exist",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeTrue<wasm::SIMDLoadStoreLane*>
            (this->info,
             SUB41(((((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currModule)->features).features & 8) >> 3,0),curr,
             "SIMD operations require SIMD [--enable-simd]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  bVar1 = SIMDLoadStoreLane::isStore(curr);
  if (bVar1) {
    text = "storeX_lane must have type none";
    TVar4.id = 0;
  }
  else {
    text = "loadX_lane must have type v128";
    TVar4.id = 6;
  }
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this->info,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.
                   id,TVar4,curr,text,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  TVar4.id = (curr->ptr->type).id;
  pMVar2 = Module::getMemory((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .currModule,(Name)(curr->memory).super_IString.str);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this->info,TVar4,(Type)(pMVar2->indexType).id,curr,
             "loadX_lane or storeX_lane address must match memory index type",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::SIMDLoadStoreLane*,wasm::Type>
            (this->info,(Type)(curr->vec->type).id,(Type)0x6,curr,
             "loadX_lane or storeX_lane vector argument must have type v128",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  uVar3 = (ulong)curr->op;
  if (uVar3 < 8) {
    TVar4.id = *(uintptr_t *)(&DAT_00bc0b08 + uVar3 * 8);
    uVar3 = *(ulong *)(&DAT_00bc0b48 + uVar3 * 8);
    bytes = SIMDLoadStoreLane::getMemBytes(curr);
    validateAlignment(this,(curr->align).addr,TVar4,bytes,false,(Expression *)curr);
    ValidationInfo::shouldBeTrue<wasm::SIMDLoadStoreLane*>
              (this->info,curr->index < uVar3,curr,"invalid lane index",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    return;
  }
  handle_unreachable("Unexpected SIMDLoadStoreLane op",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                     ,0x579);
}

Assistant:

void FunctionValidator::visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.SIMDLoadStoreLane memory must exist");
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  if (curr->isLoad()) {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::v128), curr, "loadX_lane must have type v128");
  } else {
    shouldBeEqualOrFirstIsUnreachable(
      curr->type, Type(Type::none), curr, "storeX_lane must have type none");
  }
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    indexType(curr->memory),
    curr,
    "loadX_lane or storeX_lane address must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->vec->type,
    Type(Type::v128),
    curr,
    "loadX_lane or storeX_lane vector argument must have type v128");
  size_t lanes;
  Type memAlignType = Type::none;
  switch (curr->op) {
    case Load8LaneVec128:
    case Store8LaneVec128:
      lanes = 16;
      memAlignType = Type::i32;
      break;
    case Load16LaneVec128:
    case Store16LaneVec128:
      lanes = 8;
      memAlignType = Type::i32;
      break;
    case Load32LaneVec128:
    case Store32LaneVec128:
      lanes = 4;
      memAlignType = Type::i32;
      break;
    case Load64LaneVec128:
    case Store64LaneVec128:
      lanes = 2;
      memAlignType = Type::i64;
      break;
    default:
      WASM_UNREACHABLE("Unexpected SIMDLoadStoreLane op");
  }
  Index bytes = curr->getMemBytes();
  validateAlignment(curr->align, memAlignType, bytes, /*isAtomic=*/false, curr);
  shouldBeTrue(curr->index < lanes, curr, "invalid lane index");
}